

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void parseArgs(int argc,char **argv,uint *textures,uint *start,string *output,uint *resolution,
              string *type)

{
  int iVar1;
  uint uVar2;
  ostream *this;
  string local_68 [39];
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  int iStack_3c;
  bool r;
  bool s;
  bool i;
  bool t;
  bool d;
  int opt;
  uint *resolution_local;
  string *output_local;
  uint *start_local;
  uint *textures_local;
  char **argv_local;
  int argc_local;
  
  _s = resolution;
  resolution_local = (uint *)output;
  output_local = (string *)start;
  start_local = textures;
  textures_local = (uint *)argv;
  argv_local._4_4_ = argc;
  while (iStack_3c = getopt(argv_local._4_4_,(char **)textures_local,"d: t: n: s: i: r:"),
        iStack_3c != -1) {
    switch(iStack_3c) {
    case 100:
      local_3d = 1;
      std::__cxx11::string::operator=((string *)resolution_local,_optarg);
      break;
    default:
      getUsage_abi_cxx11_((char *)local_68);
      this = std::operator<<((ostream *)&std::cout,local_68);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_68);
      exit(1);
    case 0x69:
      local_3f = 1;
      iVar1 = atoi(_optarg);
      *(int *)output_local = iVar1;
      break;
    case 0x6e:
      local_40 = 1;
      uVar2 = atoi(_optarg);
      *start_local = uVar2;
      break;
    case 0x72:
      local_41 = 1;
      uVar2 = atoi(_optarg);
      *_s = uVar2;
      break;
    case 0x74:
      local_3e = 1;
      std::__cxx11::string::operator=((string *)type,_optarg);
    }
  }
  if ((local_40 & 1) == 0) {
    *start_local = 100;
  }
  if ((local_3d & 1) == 0) {
    std::__cxx11::string::operator=((string *)resolution_local,"output/");
  }
  if ((local_41 & 1) == 0) {
    *_s = 500;
  }
  if ((local_3f & 1) == 0) {
    *(undefined4 *)output_local = 0;
  }
  if ((local_3e & 1) == 0) {
    std::__cxx11::string::operator=((string *)type,"all");
  }
  return;
}

Assistant:

void parseArgs(
    int argc,
    char** argv,
    unsigned int & textures,
    unsigned int & start,
    std::string & output,
    unsigned int & resolution,
    std::string & type)
{
    int opt;
    bool d, t, i, s, r;

    while ( (opt = getopt(argc,argv,"d: t: n: s: i: r:")) != EOF)
    {
        switch (opt)
        {
            case 'd':
                d=true; output = optarg; break;
            case 't':
                t=true; type = optarg; break;
            case 'n':
                s=true; textures = atoi(optarg); break;
            case 'i':
                i=true; start = atoi(optarg); break;
            case 'r':
                r=true; resolution = atoi(optarg); break;
            default:
                std::cout << getUsage(argv[0]) << std::endl;
                exit(EXIT_FAILURE);
        }
    }

    // If arg was not set then assign default values
    if (!s) textures    = ARG_TEXTURES_DEFAULT;
    if (!d) output      = ARG_OUTPUT_DIR_DEFAULT;
    if (!r) resolution  = ARG_IMG_RESOLUTION_DEFAULT;
    if (!i) start       = ARG_START_DEFAULT;
    if (!t) type        = ARG_TYPE_DEFAULT;
}